

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O1

ServerPtr __thiscall Scs::CreateServer(Scs *this,ServerParams *params)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ServerPtr SVar1;
  undefined1 local_29;
  Server *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (Server *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Scs::Server,Scs::Allocator<Scs::Server>,Scs::ServerParams_const&>
            (&local_20,&local_28,(Allocator<Scs::Server> *)&local_29,params);
  *(Server **)this = local_28;
  *(undefined8 *)(this + 8) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_20._M_pi;
  SVar1.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ServerPtr)SVar1.super___shared_ptr<Scs::IServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServerPtr Scs::CreateServer(const ServerParams & params)
{
	return std::allocate_shared<Server>(Allocator<Server>(), params);
}